

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

string * __thiscall LinearRegression::typeToStr_abi_cxx11_(LinearRegression *this,Type t)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  switch(in_EDX) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"short",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"size_t",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"This type does not exist \n");
    exit(1);
  }
  return in_RDI;
}

Assistant:

std::string LinearRegression::typeToStr(Type t)
{
    switch(t)
    {
    case Type::Integer : return "int";
    case Type::Double : return "double";            
    case Type::Short : return "short";
    case Type::U_Integer : return "size_t";
    default :
        ERROR("This type does not exist \n");
        exit(1);
    }
}